

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSTLUtil.hpp
# Opt level: O2

mapped_type *
de::
lookup<std::map<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::FormatFlags,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<std::pair<deqp::gls::FboUtil::ImageFormat_const,deqp::gls::FboUtil::FormatFlags>>>>
          (map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
           *map,key_type *key)

{
  mapped_type *pmVar1;
  out_of_range *this;
  
  pmVar1 = tryLookup<std::map<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::FormatFlags,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<std::pair<deqp::gls::FboUtil::ImageFormat_const,deqp::gls::FboUtil::FormatFlags>>>>
                     (map,key);
  if (pmVar1 != (mapped_type *)0x0) {
    return pmVar1;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"key not found in map");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const typename M::mapped_type& lookup (const M& map, const typename M::key_type& key)
{
	const typename M::mapped_type* ptr = tryLookup(map, key);
	if (ptr == DE_NULL)
		throw std::out_of_range("key not found in map");
	return *ptr;
}